

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall
cpplog::ConsoleLogger::logMessage
          (ConsoleLogger *this,Level level,wstring *local,time_point timestamp)

{
  bool bVar1;
  wostream *pwVar2;
  undefined8 in_RCX;
  wstring *in_RDX;
  char in_SIL;
  undefined8 in_RDI;
  lock_guard<std::mutex> guard;
  Logger *in_stack_00000330;
  time_point in_stack_00000338;
  mutex_type *in_stack_fffffffffffffee8;
  lock_guard<std::mutex> *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff10;
  Logger *in_stack_ffffffffffffff18;
  Level level_00;
  Logger *in_stack_ffffffffffffff38;
  string local_c0 [32];
  wstring local_a0 [32];
  undefined8 local_80;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  wostream *in_stack_ffffffffffffff98;
  wstring local_48 [40];
  wstring *local_20;
  char local_11;
  undefined8 local_8;
  
  level_00 = (Level)((ulong)in_RDI >> 0x38);
  local_20 = in_RDX;
  local_11 = in_SIL;
  local_8 = in_RCX;
  bVar1 = Logger::willBeLogged
                    (in_stack_ffffffffffffff18,(Level)((ulong)in_stack_ffffffffffffff10 >> 0x38));
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if ((local_11 == 'E') || (local_11 == 'S')) {
      Logger::toString_abi_cxx11_(in_stack_ffffffffffffff38,level_00);
      pwVar2 = std::operator<<((wostream *)&std::wcerr,local_48);
      std::operator<<(pwVar2," ");
      local_80 = local_8;
      Logger::toString_abi_cxx11_(in_stack_00000330,in_stack_00000338);
      pwVar2 = operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      pwVar2 = std::operator<<(pwVar2,": ");
      std::operator<<(pwVar2,local_20);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::wstring::~wstring(local_48);
    }
    else {
      Logger::toString_abi_cxx11_(in_stack_ffffffffffffff38,level_00);
      pwVar2 = std::operator<<((wostream *)&std::wcout,local_a0);
      std::operator<<(pwVar2," ");
      Logger::toString_abi_cxx11_(in_stack_00000330,in_stack_00000338);
      pwVar2 = operator<<(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      pwVar2 = std::operator<<(pwVar2,": ");
      std::operator<<(pwVar2,local_20);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::wstring::~wstring(local_a0);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x107fac);
  }
  return;
}

Assistant:

void ConsoleLogger::logMessage(Level level, const std::wstring& local, std::chrono::system_clock::time_point timestamp)
{
    if(!willBeLogged(level))
        return;
    std::lock_guard<std::mutex> guard(writeLock);
    if(level == Level::ERROR || level == Level::SEVERE)
        std::wcerr << toString(level) << " " << toString(timestamp) << ": " << local;
    else
        std::wcout << toString(level) << " " << toString(timestamp) << ": " << local;
}